

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_ftoa_rev.cc
# Opt level: O2

void require_ftoa_rev_bin(char *expected,npf_double_bin_t bin)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,expected,&local_31);
  require_ftoa_rev(&local_30,(double)bin);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void require_ftoa_rev_bin(char const *expected, npf_double_bin_t bin) {
  double dbl;
  memcpy(&dbl, &bin, sizeof(dbl));
  require_ftoa_rev(expected, dbl);
}